

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,FArrayBox *f)

{
  int iVar1;
  BaseFab<double> *in_RSI;
  ostream *in_RDI;
  
  if (operator<<(std::ostream&,amrex::FArrayBox_const&)::fabio_ascii == '\0') {
    iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,amrex::FArrayBox_const&)::fabio_ascii);
    if (iVar1 != 0) {
      __cxa_atexit(FABio_ascii::~FABio_ascii,&operator<<::fabio_ascii,&__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,amrex::FArrayBox_const&)::fabio_ascii);
    }
  }
  BaseFab<double>::nComp(in_RSI);
  FABio_ascii::write(&operator<<::fabio_ascii,(int)in_RDI,in_RSI,0);
  return in_RDI;
}

Assistant:

std::ostream&
operator<< (std::ostream&    os,
            const FArrayBox& f)
{
    static FABio_ascii fabio_ascii;
#ifdef AMREX_USE_GPU
    if (f.arena()->isManaged() || f.arena()->isDevice()) {
        FArrayBox hostfab(f.box(), f.nComp(), The_Pinned_Arena());
        Gpu::dtoh_memcpy_async(hostfab.dataPtr(), f.dataPtr(), f.size()*sizeof(Real));
        Gpu::streamSynchronize();
        fabio_ascii.write(os,hostfab,0,f.nComp());
    } else
#endif
    {
        fabio_ascii.write(os,f,0,f.nComp());
    }
    return os;
}